

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.h
# Opt level: O3

int SendRangeRequestSRF02(SRF02 *pSRF02,int device)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  int iVar6;
  long lVar7;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((uint)device < 0x10) {
    iVar1 = *(int *)&pSRF02->I2CBus;
    uVar2 = pSRF02->nbretries;
    uVar3 = pSRF02->timeout;
    lVar7 = 0;
    iVar4 = ioctl(iVar1,0x703,(ulong)pSRF02->addr[(uint)device]);
    iVar6 = 1;
    if (iVar4 == 0) {
      ioctl(iVar1,0x704,0);
      ioctl(iVar1,0x708,0);
      ioctl(iVar1,0x701,(ulong)uVar2);
      ioctl(iVar1,0x702,(ulong)uVar3 / 10);
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0x5100;
      iVar1 = *(int *)&pSRF02->I2CBus;
      do {
        iVar4 = (int)lVar7;
        sVar5 = write(iVar1,(void *)((long)&local_58 + lVar7),(ulong)(2 - iVar4));
        if ((int)sVar5 < 1) {
          return 1;
        }
        lVar7 = 1;
      } while ((uint)(iVar4 + (int)sVar5) < 2);
      iVar6 = 0;
      if ((pSRF02->bSaveRawData != 0) && ((FILE *)pSRF02->pfSaveFile != (FILE *)0x0)) {
        fwrite(&local_58,2,1,(FILE *)pSRF02->pfSaveFile);
        fflush((FILE *)pSRF02->pfSaveFile);
      }
    }
  }
  else {
    puts("Error reading data from a SRF02 : Invalid parameter. ");
    iVar6 = 3;
  }
  return iVar6;
}

Assistant:

inline int SendRangeRequestSRF02(SRF02* pSRF02, int device)
{
	unsigned char sendbuf[MAX_NB_BYTES_SRF02];
	int sendbuflen = 0;

	if ((device < 0)||(device >= MAX_NB_DEVICES_SRF02))
	{
		printf("Error reading data from a SRF02 : Invalid parameter. \n");
		return EXIT_INVALID_PARAMETER;
	}

	if (SetSlaveComputerI2CBus(pSRF02->I2CBus, pSRF02->addr[device], 0, 0, pSRF02->nbretries, pSRF02->timeout) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)COMMAND_REG_SRF02;
	sendbuf[1] = (unsigned char)REAL_RNG_CM_CMD_SRF02;
	sendbuflen = 2;

	if (WriteAllComputerI2CBus(pSRF02->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pSRF02->bSaveRawData)&&(pSRF02->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSRF02->pfSaveFile);
		fflush(pSRF02->pfSaveFile);
	}

	return EXIT_SUCCESS;
}